

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check.c
# Opt level: O0

clockid_t check_get_clockid(void)

{
  int iVar1;
  timer_t local_10;
  timer_t timerid;
  
  iVar1 = timer_create(1,(sigevent *)0x0,&local_10);
  if (iVar1 == 0) {
    timer_delete(local_10);
  }
  check_get_clockid::clockid = (clockid_t)(iVar1 == 0);
  return check_get_clockid::clockid;
}

Assistant:

clockid_t check_get_clockid()
{
    static clockid_t clockid = -1;

/*
 * Only check if we have librt available. Otherwise, the clockid
 * will be ignored anyway, as the clock_gettime() and
 * timer_create() functions will be re-implemented in libcompat.
 * Worse, if librt and alarm() are unavailable, this check
 * will result in an assert(0).
 */
#ifdef HAVE_LIBRT
    timer_t timerid;

    if(timer_create(CLOCK_MONOTONIC, NULL, &timerid) == 0)
    {
        timer_delete(timerid);
        clockid = CLOCK_MONOTONIC;
    }
    else
    {
        clockid = CLOCK_REALTIME;
    }
#else
    clockid = CLOCK_MONOTONIC;
#endif

    return clockid;
}